

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.cpp
# Opt level: O1

void duckdb::BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::InsertByteInternal
               (BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *n,uint8_t byte)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  byte bVar6;
  
  bVar1 = n->count;
  uVar2 = (ulong)bVar1;
  uVar3 = 0;
  uVar4 = uVar3;
  if (uVar2 != 0) {
    do {
      uVar4 = uVar3;
      if (byte <= n->key[uVar3]) break;
      uVar3 = uVar3 + 1;
      uVar4 = uVar2;
    } while (bVar1 != (byte)uVar3);
  }
  if ((byte)uVar4 < bVar1) {
    uVar3 = uVar2 + 0xffffffff;
    puVar5 = n->key + uVar2;
    do {
      *puVar5 = n->key[uVar3 & 0xffffffff];
      uVar3 = uVar3 - 1;
      puVar5 = (uint8_t *)((long)puVar5 + 0xffffffffffffffff);
      bVar6 = (char)uVar2 - 1;
      uVar2 = (ulong)bVar6;
    } while ((byte)uVar4 < bVar6);
  }
  n->key[uVar4 & 0xff] = byte;
  n->count = bVar1 + 1;
  return;
}

Assistant:

void BaseLeaf<CAPACITY, TYPE>::InsertByteInternal(BaseLeaf &n, const uint8_t byte) {
	// Still space. Insert the child.
	uint8_t child_pos = 0;
	while (child_pos < n.count && n.key[child_pos] < byte) {
		child_pos++;
	}

	// Move children backwards to make space.
	for (uint8_t i = n.count; i > child_pos; i--) {
		n.key[i] = n.key[i - 1];
	}

	n.key[child_pos] = byte;
	n.count++;
}